

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BasicReporter::EndSection(BasicReporter *this,string *sectionName,Counts *assertions)

{
  pointer pcVar1;
  ostream *poVar2;
  pointer pSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  string local_68;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  undefined1 local_38 [24];
  
  pSVar3 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar3[-1].emitted != true) || (pSVar3[-1].name._M_string_length == 0)) goto LAB_0012b49e;
  poVar2 = (this->m_config).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[End of section: \'",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(sectionName->_M_dataplus)._M_p,sectionName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
  if (assertions->failed == 0) {
    poVar2 = (this->m_config).stream;
    bVar7 = 1 < assertions->passed;
    pcVar5 = "";
    if (bVar7) {
      pcVar5 = "All ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,(ulong)bVar7 << 2);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)assertions->passed;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"assertion","");
    local_48 = (undefined1  [8])paVar4;
    local_40._M_p = local_38 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    poVar2 = operator<<(poVar2,(pluralise *)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," passed",7);
    if (local_40._M_p != local_38 + 8) {
      operator_delete(local_40._M_p,local_38._8_8_ + 1);
    }
    _Var6._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_0012b450;
  }
  else {
    local_48 = (undefined1  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"assertion","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"All ","");
    ReportCounts(this,(string *)local_48,assertions,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68.field_2._M_allocated_capacity = local_38._0_8_;
    _Var6._M_p = (pointer)local_48;
    if (local_48 != (undefined1  [8])local_38) {
LAB_0012b450:
      operator_delete(_Var6._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  poVar2 = (this->m_config).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pSVar3 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012b49e:
  (this->m_sectionSpans).
  super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3 + -1;
  pcVar1 = pSVar3[-1].name._M_dataplus._M_p;
  paVar4 = &pSVar3[-1].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void EndSection( const std::string& sectionName, const Counts& assertions ) {

            SpanInfo& sectionSpan = m_sectionSpans.back();
            if( sectionSpan.emitted && !sectionSpan.name.empty() ) {
                m_config.stream << "[End of section: '" << sectionName << "' ";

                if( assertions.failed ) {
                    TextColour colour( TextColour::ResultError );
                    ReportCounts( "assertion", assertions);
                }
                else {
                    TextColour colour( TextColour::ResultSuccess );
                    m_config.stream   << ( assertions.passed > 1 ? "All " : "" )
                                        << pluralise( assertions.passed, "assertion" ) << " passed" ;
                }
                m_config.stream << "]\n" << std::endl;
            }
            m_sectionSpans.pop_back();
        }